

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

BOOL __thiscall GlobOptBlockData::IsArgumentsOpnd(GlobOptBlockData *this,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  BOOLEAN BVar7;
  undefined4 *puVar8;
  _func_int **pp_Var9;
  PropertySym *propertySym;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar3 == OpndKindReg) {
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x81,"(this->IsRegOpnd())","Bad call to AsRegOpnd() const");
      if (!bVar5) goto LAB_004935a7;
      *puVar8 = 0;
    }
    pp_Var9 = opnd[1]._vptr_Opnd;
  }
  else {
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar4 != OpndKindSym) {
      if (OVar3 == OpndKindIndir) {
        OVar3 = IR::Opnd::GetKind(opnd);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1d0,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd() const");
          if (!bVar5) goto LAB_004935a7;
          *puVar8 = 0;
        }
        lVar1 = *(long *)&opnd[1].m_valueType;
        OVar3 = IR::Opnd::GetKind(opnd);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1d0,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd() const");
          if (!bVar5) goto LAB_004935a7;
          *puVar8 = 0;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->argObjSyms,*(BVIndex *)(opnd[1]._vptr_Opnd[2] + 0x10));
        if (BVar7 != '\0') {
          return 1;
        }
        if (lVar1 != 0) {
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->argObjSyms,*(BVIndex *)(*(long *)(lVar1 + 0x10) + 0x10));
          return (uint)(BVar7 != '\0');
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                           ,0x501,"(false)","Unknown type");
        if (!bVar5) {
LAB_004935a7:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      return 0;
    }
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x4d,"(this->IsSymOpnd())","Bad call to AsSymOpnd() const");
      if (!bVar5) goto LAB_004935a7;
      *puVar8 = 0;
    }
    pp_Var9 = opnd[1]._vptr_Opnd;
    if (pp_Var9 == (_func_int **)0x0) {
      return 0;
    }
    if (*(char *)((long)pp_Var9 + 0x14) != '\x02') {
      return 0;
    }
    pp_Var9 = (_func_int **)pp_Var9[4];
  }
  bVar6 = BVSparse<Memory::JitArenaAllocator>::Test(this->argObjSyms,*(BVIndex *)(pp_Var9 + 2));
  return (uint)bVar6;
}

Assistant:

BOOL
GlobOptBlockData::IsArgumentsOpnd(IR::Opnd const* opnd) const
{
    SymID id = 0;
    if (opnd->IsRegOpnd())
    {
        id = opnd->AsRegOpnd()->m_sym->m_id;
        return this->IsArgumentsSymID(id);
    }
    else if (opnd->IsSymOpnd())
    {
        Sym const *sym = opnd->AsSymOpnd()->m_sym;
        if (sym && sym->IsPropertySym())
        {
            PropertySym const *propertySym = sym->AsPropertySym();
            id = propertySym->m_stackSym->m_id;
            return this->IsArgumentsSymID(id);
        }
        return false;
    }
    else if (opnd->IsIndirOpnd())
    {
        IR::RegOpnd const *indexOpnd = opnd->AsIndirOpnd()->GetIndexOpnd();
        IR::RegOpnd const *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
        return this->IsArgumentsSymID(baseOpnd->m_sym->m_id) || (indexOpnd && this->IsArgumentsSymID(indexOpnd->m_sym->m_id));
    }
    AssertMsg(false, "Unknown type");
    return false;
}